

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,string *emsg,bool *changed)

{
  string *this;
  char *pcVar1;
  string *this_00;
  long lVar2;
  StringEntry *pSVar3;
  size_type sVar4;
  size_t sVar5;
  ostream *poVar6;
  long *plVar7;
  undefined1 *puVar8;
  byte bVar9;
  uint uVar10;
  string *psVar11;
  ulong uVar12;
  bool bVar13;
  ulong uVar14;
  bool bVar15;
  char *se_name [2];
  StringEntry *se [2];
  cmELF elf;
  ostringstream e;
  cmSystemToolsRPathInfo rp [2];
  string *local_388;
  ulong local_380;
  string *local_378;
  string *local_370;
  StringEntry *local_368 [2];
  long local_358 [2];
  string *local_348;
  bool *local_340;
  StringEntry *local_338;
  string *local_330;
  ulong local_328;
  cmELF local_320;
  long *local_2f8 [2];
  long local_2e8 [2];
  undefined1 local_2d8 [16];
  _func_int *local_2c8 [2];
  byte abStack_2b8 [80];
  ios_base local_268 [136];
  ios_base local_1e0 [264];
  size_type local_d8 [2];
  ulong local_c8 [2];
  undefined1 local_b8 [16];
  string local_a8 [8];
  ulong local_a0 [11];
  long local_48 [3];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar2 = 0xa0;
  puVar8 = local_b8;
  do {
    *(undefined1 **)(puVar8 + -0x10) = puVar8;
    *(undefined8 *)(puVar8 + -8) = 0;
    *puVar8 = 0;
    *(undefined1 **)(puVar8 + 0x10) = puVar8 + 0x20;
    *(undefined8 *)(puVar8 + 0x18) = 0;
    puVar8[0x20] = 0;
    puVar8 = puVar8 + 0x50;
    lVar2 = lVar2 + -0x50;
  } while (lVar2 != 0);
  local_378 = newRPath;
  local_370 = oldRPath;
  local_340 = changed;
  cmELF::cmELF(&local_320,(file->_M_dataplus)._M_p);
  local_358[0] = 0;
  local_358[1] = 0;
  local_368[0] = (StringEntry *)0x0;
  local_368[1] = (StringEntry *)0x0;
  pSVar3 = cmELF::GetRPath(&local_320);
  if (pSVar3 != (StringEntry *)0x0) {
    local_368[0] = (StringEntry *)0x59edd8;
    local_358[0] = (long)pSVar3;
  }
  uVar10 = (uint)(pSVar3 != (StringEntry *)0x0);
  pSVar3 = cmELF::GetRunPath(&local_320);
  if (pSVar3 != (StringEntry *)0x0) {
    *(StringEntry **)((long)local_358 + (ulong)(uVar10 * 8)) = pSVar3;
    *(char **)((long)local_368 + (ulong)(uVar10 * 8)) = "RUNPATH";
    uVar10 = uVar10 + 1;
  }
  local_388 = emsg;
  if (uVar10 == 0) {
    if (local_378->_M_string_length == 0) {
      bVar13 = true;
      uVar10 = 0;
      bVar15 = false;
    }
    else {
      if (emsg == (string *)0x0) {
        bVar15 = false;
        goto LAB_0035917d;
      }
      uVar10 = 0;
      std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x59d68e);
      std::__cxx11::string::_M_append((char *)emsg,(ulong)local_320.ErrorMessage._M_dataplus._M_p);
      bVar15 = false;
      bVar13 = false;
    }
  }
  else if (uVar10 == 0) {
    bVar15 = true;
LAB_0035917d:
    uVar10 = 0;
    bVar13 = false;
  }
  else {
    local_348 = file;
    local_328 = (ulong)uVar10;
    uVar14 = 0;
    uVar12 = 0;
    do {
      if (((int)uVar12 == 0) || (local_d8[0] != *(size_type *)(local_358[uVar14] + 0x20))) {
        psVar11 = (string *)local_358[uVar14];
        local_380 = uVar12;
        sVar4 = cmSystemToolsFindRPath(psVar11,local_370);
        if (sVar4 == 0xffffffffffffffff) {
          sVar4 = cmSystemToolsFindRPath(psVar11,local_378);
          this_00 = local_388;
          if (local_388 == (string *)0x0 || sVar4 != 0xffffffffffffffff) {
            bVar9 = (sVar4 != 0xffffffffffffffff) * '\x03' + 1;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,"The current ",0xc);
            pSVar3 = local_368[uVar14];
            if (pSVar3 == (StringEntry *)0x0) {
              std::ios::clear((int)(_func_int *)
                                   ((long)&local_388 +
                                   (long)*(_func_int **)(local_2d8._0_8_ + -0x18)) + 0xb0);
            }
            else {
              sVar5 = strlen((char *)pSVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,(char *)pSVar3,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8," is:\n",5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"  ",2);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2d8,(psVar11->_M_dataplus)._M_p,
                                psVar11->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"which does not contain:\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(local_370->_M_dataplus)._M_p,local_370->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"as was expected.",0x10);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)this_00,(string *)local_2f8);
            if (local_2f8[0] != local_2e8) {
              operator_delete(local_2f8[0],local_2e8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
            std::ios_base::~ios_base(local_268);
            bVar9 = 1;
          }
        }
        else {
          lVar2 = (long)(int)local_380;
          local_d8[lVar2 * 10] = (size_type)psVar11[1]._M_dataplus._M_p;
          local_d8[lVar2 * 10 + 1] = psVar11[1]._M_string_length;
          local_330 = psVar11;
          pSVar3 = local_368[uVar14];
          pcVar1 = (char *)local_c8[lVar2 * 10 + 1];
          strlen((char *)pSVar3);
          psVar11 = local_330;
          local_338 = pSVar3;
          std::__cxx11::string::_M_replace((ulong)(local_c8 + lVar2 * 10),0,pcVar1,(ulong)pSVar3);
          std::__cxx11::string::substr((ulong)local_2d8,(ulong)psVar11);
          this = local_a8 + lVar2 * 0x50;
          std::__cxx11::string::operator=(this,(string *)local_2d8);
          if ((_func_int **)local_2d8._0_8_ != local_2c8) {
            operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0] + 1));
          }
          std::__cxx11::string::_M_append((char *)this,(ulong)(local_378->_M_dataplus)._M_p);
          std::__cxx11::string::substr((ulong)local_2d8,(ulong)psVar11);
          std::__cxx11::string::_M_append((char *)this,local_2d8._0_8_);
          if ((_func_int **)local_2d8._0_8_ != local_2c8) {
            operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0] + 1));
          }
          if (local_d8[lVar2 * 10 + 1] < local_a0[lVar2 * 10] + 1) {
            bVar9 = 1;
            if (local_388 != (string *)0x0) {
              std::__cxx11::string::_M_replace
                        ((ulong)local_388,0,(char *)local_388->_M_string_length,0x59d6fe);
              std::__cxx11::string::append((char *)local_388);
              std::__cxx11::string::append((char *)local_388);
            }
          }
          else {
            local_380 = (ulong)((int)local_380 + 1);
            bVar9 = 0;
          }
        }
        uVar12 = local_380;
        if ((bVar9 & 3) != 0) goto LAB_0035910f;
      }
      uVar14 = uVar14 + 1;
    } while (local_328 != uVar14);
    bVar9 = 0;
LAB_0035910f:
    uVar10 = (uint)uVar12;
    bVar15 = (bVar9 & 5) == 0;
    bVar13 = false;
    emsg = local_388;
    file = local_348;
  }
  cmELF::~cmELF(&local_320);
  if (bVar15) {
    if (uVar10 != 0) {
      std::ofstream::ofstream(local_2d8,(file->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
      if ((abStack_2b8[(long)*(_func_int **)(local_2d8._0_8_ + -0x18)] & 5) == 0) {
        bVar15 = (int)uVar10 < 1;
        if (0 < (int)uVar10) {
          local_380 = (ulong)uVar10;
          uVar12 = 0;
          do {
            plVar7 = (long *)std::ostream::seekp((ostream *)local_2d8,local_d8[uVar12 * 10],0);
            psVar11 = local_388;
            if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
              if (local_388 != (string *)0x0) {
                std::__cxx11::string::_M_replace
                          ((ulong)local_388,0,(char *)local_388->_M_string_length,0x59d74f);
                std::__cxx11::string::_M_append((char *)psVar11,local_c8[uVar12 * 10]);
LAB_00359325:
                std::__cxx11::string::append((char *)psVar11);
              }
              goto LAB_0035932d;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,*(char **)(local_a8 + uVar12 * 0x50),
                       local_a0[uVar12 * 10]);
            for (uVar14 = local_a0[uVar12 * 10]; psVar11 = local_388,
                uVar14 < local_d8[uVar12 * 10 + 1]; uVar14 = uVar14 + 1) {
              local_320.Internal._0_1_ = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,(char *)&local_320,1);
            }
            if ((abStack_2b8[(long)*(_func_int **)(local_2d8._0_8_ + -0x18)] & 5) != 0) {
              if (local_388 != (string *)0x0) {
                std::__cxx11::string::_M_replace
                          ((ulong)local_388,0,(char *)local_388->_M_string_length,0x59d761);
                std::__cxx11::string::_M_append((char *)psVar11,local_c8[uVar12 * 10]);
                goto LAB_00359325;
              }
              goto LAB_0035932d;
            }
            uVar12 = uVar12 + 1;
            bVar15 = local_380 <= uVar12;
          } while (uVar12 != local_380);
        }
      }
      else if (emsg == (string *)0x0) {
LAB_0035932d:
        bVar15 = false;
        bVar13 = false;
      }
      else {
        bVar15 = false;
        std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x59d730);
        bVar13 = false;
      }
      local_2d8._0_8_ = _VTT;
      *(undefined8 *)(local_2d8 + (long)_VTT[-3]) = __M_insert<void_const*>;
      std::filebuf::~filebuf((filebuf *)(local_2d8 + 8));
      std::ios_base::~ios_base(local_1e0);
      bVar13 = (bool)(bVar13 | bVar15);
      if ((local_340 == (bool *)0x0) || (bVar15 == false)) goto LAB_00359381;
      *local_340 = true;
    }
    bVar13 = true;
  }
LAB_00359381:
  lVar2 = -0xa0;
  plVar7 = local_48;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    if (plVar7 + -4 != (long *)plVar7[-6]) {
      operator_delete((long *)plVar7[-6],plVar7[-4] + 1);
    }
    plVar7 = plVar7 + -10;
    lVar2 = lVar2 + 0x50;
  } while (lVar2 != 0);
  return bVar13;
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath,
                                std::string* emsg,
                                bool* changed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if(changed)
    {
    *changed = false;
    }
  int rp_count = 0;
  cmSystemToolsRPathInfo rp[2];
  {
  // Parse the ELF binary.
  cmELF elf(file.c_str());

  // Get the RPATH and RUNPATH entries from it.
  int se_count = 0;
  cmELF::StringEntry const* se[2] = {0, 0};
  const char* se_name[2] = {0, 0};
  if(cmELF::StringEntry const* se_rpath = elf.GetRPath())
    {
    se[se_count] = se_rpath;
    se_name[se_count] = "RPATH";
    ++se_count;
    }
  if(cmELF::StringEntry const* se_runpath = elf.GetRunPath())
    {
    se[se_count] = se_runpath;
    se_name[se_count] = "RUNPATH";
    ++se_count;
    }
  if(se_count == 0)
    {
    if(newRPath.empty())
      {
      // The new rpath is empty and there is no rpath anyway so it is
      // okay.
      return true;
      }
    else
      {
      if(emsg)
        {
        *emsg = "No valid ELF RPATH or RUNPATH entry exists in the file; ";
        *emsg += elf.GetErrorMessage();
        }
      return false;
      }
    }

  for(int i=0; i < se_count; ++i)
    {
    // If both RPATH and RUNPATH refer to the same string literal it
    // needs to be changed only once.
    if(rp_count && rp[0].Position == se[i]->Position)
      {
      continue;
      }

    // Make sure the current rpath contains the old rpath.
    std::string::size_type pos =
      cmSystemToolsFindRPath(se[i]->Value, oldRPath);
    if(pos == std::string::npos)
      {
      // If it contains the new rpath instead then it is okay.
      if(cmSystemToolsFindRPath(se[i]->Value, newRPath) != std::string::npos)
        {
        continue;
        }
      if(emsg)
        {
        std::ostringstream e;
        e << "The current " << se_name[i] << " is:\n"
          << "  " << se[i]->Value << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
        *emsg = e.str();
        }
      return false;
      }

    // Store information about the entry in the file.
    rp[rp_count].Position = se[i]->Position;
    rp[rp_count].Size = se[i]->Size;
    rp[rp_count].Name = se_name[i];

    // Construct the new value which preserves the part of the path
    // not being changed.
    rp[rp_count].Value = se[i]->Value.substr(0, pos);
    rp[rp_count].Value += newRPath;
    rp[rp_count].Value += se[i]->Value.substr(pos+oldRPath.length(),
                                              oldRPath.npos);

    // Make sure there is enough room to store the new rpath and at
    // least one null terminator.
    if(rp[rp_count].Size < rp[rp_count].Value.length()+1)
      {
      if(emsg)
        {
        *emsg = "The replacement path is too long for the ";
        *emsg += se_name[i];
        *emsg += " entry.";
        }
      return false;
      }

    // This entry is ready for update.
    ++rp_count;
    }
  }

  // If no runtime path needs to be changed, we are done.
  if(rp_count == 0)
    {
    return true;
    }

  {
  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                  std::ios::in | std::ios::out | std::ios::binary);
  if(!f)
    {
    if(emsg)
      {
      *emsg = "Error opening file for update.";
      }
    return false;
    }

  // Store the new RPATH and RUNPATH strings.
  for(int i=0; i < rp_count; ++i)
    {
    // Seek to the RPATH position.
    if(!f.seekp(rp[i].Position))
      {
      if(emsg)
        {
        *emsg = "Error seeking to ";
        *emsg += rp[i].Name;
        *emsg += " position.";
        }
      return false;
      }

    // Write the new rpath.  Follow it with enough null terminators to
    // fill the string table entry.
    f << rp[i].Value;
    for(unsigned long j=rp[i].Value.length(); j < rp[i].Size; ++j)
      {
      f << '\0';
      }

    // Make sure it wrote correctly.
    if(!f)
      {
      if(emsg)
        {
        *emsg = "Error writing the new ";
        *emsg += rp[i].Name;
        *emsg += " string to the file.";
        }
      return false;
      }
    }
  }

  // Everything was updated successfully.
  if(changed)
    {
    *changed = true;
    }
  return true;
#else
  (void)file;
  (void)oldRPath;
  (void)newRPath;
  (void)emsg;
  (void)changed;
  return false;
#endif
}